

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall
icu_63::TimeZoneNamesImpl::internalLoadAllDisplayNames(TimeZoneNamesImpl *this,UErrorCode *status)

{
  UHashtable *hash;
  UBool UVar1;
  UnicodeString *that;
  char16_t *key;
  void *pvVar2;
  void *value;
  UnicodeString copy;
  StringEnumeration *tzIDs;
  UnicodeString *id;
  undefined1 local_30 [8];
  ZoneStringsLoader loader;
  UErrorCode *status_local;
  TimeZoneNamesImpl *this_local;
  
  if (this->fNamesFullyLoaded == '\0') {
    this->fNamesFullyLoaded = '\x01';
    loader.keyToLoader = (UHashtable *)status;
    ZoneStringsLoader::ZoneStringsLoader((ZoneStringsLoader *)local_30,this,status);
    ZoneStringsLoader::load((ZoneStringsLoader *)local_30,(UErrorCode *)loader.keyToLoader);
    UVar1 = ::U_FAILURE(*(UErrorCode *)&(loader.keyToLoader)->elements);
    if (UVar1 == '\0') {
      copy.fUnion._48_8_ =
           TimeZone::createTimeZoneIDEnumeration
                     (UCAL_ZONE_TYPE_CANONICAL,(char *)0x0,(int32_t *)0x0,
                      (UErrorCode *)loader.keyToLoader);
      UVar1 = ::U_SUCCESS(*(UErrorCode *)&(loader.keyToLoader)->elements);
      if (UVar1 != '\0') {
        while ((that = (UnicodeString *)
                       (**(code **)(*(long *)copy.fUnion._48_8_ + 0x38))
                                 (copy.fUnion._48_8_,loader.keyToLoader),
               that != (UnicodeString *)0x0 &&
               (UVar1 = ::U_FAILURE(*(UErrorCode *)&(loader.keyToLoader)->elements), UVar1 == '\0'))
              ) {
          icu_63::UnicodeString::UnicodeString((UnicodeString *)&value,that);
          hash = this->fTZNamesMap;
          key = icu_63::UnicodeString::getTerminatedBuffer((UnicodeString *)&value);
          pvVar2 = uhash_get_63(hash,key);
          if (pvVar2 == (void *)0x0) {
            loadStrings(this,that,(UErrorCode *)loader.keyToLoader);
          }
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)&value);
        }
      }
      if ((copy.fUnion._48_8_ != 0) && (copy.fUnion._48_8_ != 0)) {
        (**(code **)(*(long *)copy.fUnion._48_8_ + 8))();
      }
    }
    ZoneStringsLoader::~ZoneStringsLoader((ZoneStringsLoader *)local_30);
  }
  return;
}

Assistant:

void TimeZoneNamesImpl::internalLoadAllDisplayNames(UErrorCode& status) {
    if (!fNamesFullyLoaded) {
        fNamesFullyLoaded = TRUE;

        ZoneStringsLoader loader(*this, status);
        loader.load(status);
        if (U_FAILURE(status)) { return; }

        const UnicodeString *id;

        // load strings for all zones
        StringEnumeration *tzIDs = TimeZone::createTimeZoneIDEnumeration(
            UCAL_ZONE_TYPE_CANONICAL, NULL, NULL, status);
        if (U_SUCCESS(status)) {
            while ((id = tzIDs->snext(status)) != NULL) {
                if (U_FAILURE(status)) {
                    break;
                }
                UnicodeString copy(*id);
                void* value = uhash_get(fTZNamesMap, copy.getTerminatedBuffer());
                if (value == NULL) {
                    // loadStrings also loads related metazone strings
                    loadStrings(*id, status);
                }
            }
        }
        if (tzIDs != NULL) {
            delete tzIDs;
        }
    }
}